

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floattype.cpp
# Opt level: O0

void __thiscall FloatType::FloatType(FloatType *this)

{
  initializer_list<Function> __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>
  __l_00;
  initializer_list<std::pair<const_OperatorChar,_Operator>_> __l_01;
  initializer_list<std::pair<const_OperatorChar,_Operator>_> __l_02;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>
  *local_1708;
  Function *local_16f0;
  pair<const_OperatorChar,_Operator> *local_1590;
  pair<const_OperatorChar,_Operator> *local_1570;
  allocator<Function> local_14eb;
  undefined1 local_14ea;
  allocator local_14e9;
  string local_14e8;
  anon_class_8_1_8991fb9c local_14c8;
  ExternalFunction local_14c0;
  allocator local_1499;
  string local_1498;
  allocator local_1471;
  string local_1470;
  anon_class_8_1_8991fb9c local_1450;
  ExternalFunction local_1448;
  allocator local_1421;
  string local_1420;
  allocator local_13f9;
  string local_13f8;
  anon_class_8_1_8991fb9c local_13d8;
  ExternalFunction local_13d0;
  allocator local_13a9;
  string local_13a8;
  allocator local_1381;
  string local_1380;
  anon_class_8_1_8991fb9c local_1360;
  ExternalFunction local_1358;
  allocator local_1331;
  string local_1330;
  allocator local_1309;
  string local_1308;
  anon_class_8_1_8991fb9c local_12e8;
  ExternalFunction local_12e0;
  allocator local_12b9;
  string local_12b8;
  allocator local_1291;
  string local_1290;
  anon_class_8_1_8991fb9c local_1270;
  ExternalFunction local_1268;
  allocator local_1241;
  string local_1240;
  allocator local_1219;
  string local_1218;
  anon_class_8_1_8991fb9c local_11f8;
  ExternalFunction local_11f0;
  allocator local_11c9;
  string local_11c8;
  allocator local_11a1;
  string local_11a0;
  anon_class_8_1_8991fb9c local_1180;
  ExternalFunction local_1178;
  allocator local_1151;
  string local_1150;
  allocator local_1129;
  string local_1128;
  anon_class_8_1_8991fb9c local_1108;
  ExternalFunction local_1100;
  allocator local_10d9;
  string local_10d8;
  allocator local_10b1;
  string local_10b0;
  anon_class_8_1_8991fb9c local_1090;
  ExternalFunction local_1088;
  allocator local_1061;
  string local_1060;
  allocator local_1039;
  string local_1038;
  anon_class_8_1_8991fb9c local_1018;
  ExternalFunction local_1010;
  allocator local_fe9;
  string local_fe8;
  allocator local_fc1;
  string local_fc0;
  anon_class_8_1_8991fb9c local_fa0;
  ExternalFunction local_f98;
  allocator local_f71;
  string local_f70;
  allocator local_f49;
  string local_f48;
  anon_class_8_1_8991fb9c local_f28;
  ExternalFunction local_f20;
  allocator local_ef9;
  string local_ef8;
  Function *local_ed8;
  Function local_ed0;
  Function local_e50;
  Function local_dd0;
  Function local_d50;
  Function local_cd0;
  Function local_c50;
  Function local_bd0;
  Function local_b50;
  Function local_ad0;
  Function local_a50;
  Function local_9d0;
  Function local_950;
  Function local_8d0;
  iterator local_850;
  size_type local_848;
  vector<Function,_std::allocator<Function>_> local_840;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>
  local_823;
  key_equal local_822;
  hasher local_821;
  ResultValue local_820;
  ResultValue local_7f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>
  *local_7d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>
  local_7c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>
  local_780;
  iterator local_738;
  size_type local_730;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>_>
  local_728;
  EnvironmentScope local_6f0;
  undefined1 local_679;
  OperatorChar local_678 [2];
  anon_class_1_0_00000001 local_671;
  UnaryOperatorFn local_670;
  OperatorChar local_64b;
  Operator local_648;
  char local_5f1;
  pair<const_OperatorChar,_Operator> *local_5f0;
  pair<const_OperatorChar,_Operator> local_5e8;
  iterator local_590;
  undefined1 local_588 [24];
  BinaryOperatorFn local_570;
  OperatorChar local_54b;
  Operator local_548;
  char local_4f1;
  OperatorChar local_4f0 [2];
  anon_class_1_0_00000001 local_4e9;
  BinaryOperatorFn local_4e8;
  OperatorChar local_4c3;
  Operator local_4c0;
  char local_469;
  OperatorChar local_468 [2];
  anon_class_1_0_00000001 local_461;
  BinaryOperatorFn local_460;
  OperatorChar local_43b;
  Operator local_438;
  char local_3e1;
  OperatorChar local_3e0 [2];
  anon_class_1_0_00000001 local_3d9;
  BinaryOperatorFn local_3d8;
  OperatorChar local_3b3;
  Operator local_3b0;
  char local_359;
  OperatorChar local_358 [2];
  anon_class_1_0_00000001 local_351;
  BinaryOperatorFn local_350;
  OperatorChar local_32b;
  Operator local_328;
  char local_2d1;
  OperatorChar local_2d0 [2];
  anon_class_1_0_00000001 local_2c9;
  BinaryOperatorFn local_2c8;
  OperatorChar local_2a3;
  Operator local_2a0;
  char local_249;
  pair<const_OperatorChar,_Operator> *local_248;
  pair<const_OperatorChar,_Operator> local_240;
  pair<const_OperatorChar,_Operator> local_1e8;
  pair<const_OperatorChar,_Operator> local_190;
  pair<const_OperatorChar,_Operator> local_138;
  pair<const_OperatorChar,_Operator> local_e0;
  pair<const_OperatorChar,_Operator> local_88;
  iterator local_30;
  bool local_28;
  char cStack_27;
  char cStack_26;
  undefined1 uStack_25;
  int iStack_24;
  undefined8 local_10;
  FloatType *this_local;
  
  local_10 = this;
  NumberType::NumberType(&this->super_NumberType);
  (this->super_NumberType)._vptr_NumberType = (_func_int **)&PTR__FloatType_001e7a08;
  std::
  unordered_map<OperatorChar,_Operator,_std::hash<OperatorChar>,_std::equal_to<OperatorChar>,_std::allocator<std::pair<const_OperatorChar,_Operator>_>_>
  ::unordered_map(&this->mBinaryOperators);
  std::
  unordered_map<OperatorChar,_Operator,_std::hash<OperatorChar>,_std::equal_to<OperatorChar>,_std::allocator<std::pair<const_OperatorChar,_Operator>_>_>
  ::unordered_map(&this->mUnaryOperators);
  EnvironmentScope::EnvironmentScope(&this->mEnvironment);
  local_588[0xf] = 1;
  local_248 = &local_240;
  local_249 = '^';
  OperatorChar::OperatorChar(&local_2a3,'^');
  std::function<ResultValue(ResultValue,ResultValue)>::function<FloatType::FloatType()::__0,void>
            ((function<ResultValue(ResultValue,ResultValue)> *)&local_2c8,&local_2c9);
  local_2d0[0].mOp2 = local_2a3.mOp2;
  local_2d0[0].mIsTwoChars = local_2a3.mIsTwoChars;
  local_2d0[0].mOp1 = local_2a3.mOp1;
  Operator::binary(&local_2a0,local_2d0[0],6,RIGHT,&local_2c8);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            (&local_240,&local_249,&local_2a0);
  local_2d1 = '*';
  local_248 = &local_1e8;
  OperatorChar::OperatorChar(&local_32b,'*');
  std::function<ResultValue(ResultValue,ResultValue)>::function<FloatType::FloatType()::__1,void>
            ((function<ResultValue(ResultValue,ResultValue)> *)&local_350,&local_351);
  local_358[0].mOp2 = local_32b.mOp2;
  local_358[0].mIsTwoChars = local_32b.mIsTwoChars;
  local_358[0].mOp1 = local_32b.mOp1;
  Operator::binary(&local_328,local_358[0],5,LEFT,&local_350);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            (&local_1e8,&local_2d1,&local_328);
  local_359 = '/';
  local_248 = &local_190;
  OperatorChar::OperatorChar(&local_3b3,'/');
  std::function<ResultValue(ResultValue,ResultValue)>::function<FloatType::FloatType()::__2,void>
            ((function<ResultValue(ResultValue,ResultValue)> *)&local_3d8,&local_3d9);
  local_3e0[0].mOp2 = local_3b3.mOp2;
  local_3e0[0].mIsTwoChars = local_3b3.mIsTwoChars;
  local_3e0[0].mOp1 = local_3b3.mOp1;
  Operator::binary(&local_3b0,local_3e0[0],5,LEFT,&local_3d8);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            (&local_190,&local_359,&local_3b0);
  local_3e1 = '+';
  local_248 = &local_138;
  OperatorChar::OperatorChar(&local_43b,'+');
  std::function<ResultValue(ResultValue,ResultValue)>::function<FloatType::FloatType()::__3,void>
            ((function<ResultValue(ResultValue,ResultValue)> *)&local_460,&local_461);
  local_468[0].mOp2 = local_43b.mOp2;
  local_468[0].mIsTwoChars = local_43b.mIsTwoChars;
  local_468[0].mOp1 = local_43b.mOp1;
  Operator::binary(&local_438,local_468[0],4,LEFT,&local_460);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            (&local_138,&local_3e1,&local_438);
  local_469 = '-';
  local_248 = &local_e0;
  OperatorChar::OperatorChar(&local_4c3,'-');
  std::function<ResultValue(ResultValue,ResultValue)>::function<FloatType::FloatType()::__4,void>
            ((function<ResultValue(ResultValue,ResultValue)> *)&local_4e8,&local_4e9);
  local_4f0[0].mOp2 = local_4c3.mOp2;
  local_4f0[0].mIsTwoChars = local_4c3.mIsTwoChars;
  local_4f0[0].mOp1 = local_4c3.mOp1;
  Operator::binary(&local_4c0,local_4f0[0],4,LEFT,&local_4e8);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            (&local_e0,&local_469,&local_4c0);
  local_4f1 = '=';
  local_248 = &local_88;
  OperatorChar::OperatorChar(&local_54b,'=');
  std::function<ResultValue(ResultValue,ResultValue)>::function<FloatType::FloatType()::__5,void>
            ((function<ResultValue(ResultValue,ResultValue)> *)&local_570,
             (anon_class_1_0_00000001 *)(local_588 + 0x17));
  local_588[0x12] = local_54b.mOp2;
  local_588[0x10] = local_54b.mIsTwoChars;
  local_588[0x11] = local_54b.mOp1;
  Operator::binary(&local_548,(OperatorChar)local_588._16_3_,1,RIGHT,&local_570);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            (&local_88,&local_4f1,&local_548);
  local_588[0xf] = 0;
  local_30 = &local_240;
  local_28 = true;
  cStack_27 = '\0';
  cStack_26 = '\0';
  uStack_25 = 0;
  iStack_24 = 0;
  __l_02._M_len = 6;
  __l_02._M_array = local_30;
  std::
  unordered_map<OperatorChar,_Operator,_std::hash<OperatorChar>,_std::equal_to<OperatorChar>,_std::allocator<std::pair<const_OperatorChar,_Operator>_>_>
  ::operator=(&this->mBinaryOperators,__l_02);
  local_1570 = (pair<const_OperatorChar,_Operator> *)&local_30;
  do {
    local_1570 = local_1570 + -1;
    std::pair<const_OperatorChar,_Operator>::~pair(local_1570);
  } while (local_1570 != &local_240);
  Operator::~Operator(&local_548);
  std::function<ResultValue_(ResultValue,_ResultValue)>::~function(&local_570);
  Operator::~Operator(&local_4c0);
  std::function<ResultValue_(ResultValue,_ResultValue)>::~function(&local_4e8);
  Operator::~Operator(&local_438);
  std::function<ResultValue_(ResultValue,_ResultValue)>::~function(&local_460);
  Operator::~Operator(&local_3b0);
  std::function<ResultValue_(ResultValue,_ResultValue)>::~function(&local_3d8);
  Operator::~Operator(&local_328);
  std::function<ResultValue_(ResultValue,_ResultValue)>::~function(&local_350);
  Operator::~Operator(&local_2a0);
  std::function<ResultValue_(ResultValue,_ResultValue)>::~function(&local_2c8);
  local_679 = 1;
  local_5f0 = &local_5e8;
  local_5f1 = '-';
  OperatorChar::OperatorChar(&local_64b,'-');
  std::function<ResultValue(ResultValue)>::function<FloatType::FloatType()::__6,void>
            ((function<ResultValue(ResultValue)> *)&local_670,&local_671);
  local_678[0].mOp2 = local_64b.mOp2;
  local_678[0].mIsTwoChars = local_64b.mIsTwoChars;
  local_678[0].mOp1 = local_64b.mOp1;
  Operator::unary(&local_648,local_678[0],7,LEFT,&local_670);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            (&local_5e8,&local_5f1,&local_648);
  local_679 = 0;
  local_590 = &local_5e8;
  local_588[0] = true;
  local_588[1] = '\0';
  local_588[2] = '\0';
  local_588[3] = 0;
  local_588._4_4_ = 0;
  __l_01._M_len = 1;
  __l_01._M_array = local_590;
  std::
  unordered_map<OperatorChar,_Operator,_std::hash<OperatorChar>,_std::equal_to<OperatorChar>,_std::allocator<std::pair<const_OperatorChar,_Operator>_>_>
  ::operator=(&this->mUnaryOperators,__l_01);
  local_1590 = (pair<const_OperatorChar,_Operator> *)&local_590;
  do {
    local_1590 = local_1590 + -1;
    std::pair<const_OperatorChar,_Operator>::~pair(local_1590);
  } while (local_1590 != &local_5e8);
  Operator::~Operator(&local_648);
  std::function<ResultValue_(ResultValue)>::~function(&local_670);
  local_7d0 = &local_7c8;
  ResultValue::ResultValue(&local_7f8,3.141592653589793);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>
  ::pair<const_char_(&)[3],_ResultValue,_true>(&local_7c8,(char (*) [3])"pi",&local_7f8);
  local_7d0 = &local_780;
  ResultValue::ResultValue(&local_820,2.718281828459045);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>
  ::pair<const_char_(&)[2],_ResultValue,_true>(&local_780,(char (*) [2])0x1b91e1,&local_820);
  local_738 = &local_7c8;
  local_730 = 2;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>
  ::allocator(&local_823);
  __l_00._M_len = local_730;
  __l_00._M_array = local_738;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>_>
  ::unordered_map(&local_728,__l_00,0,&local_821,&local_822,&local_823);
  local_14ea = 1;
  local_ed8 = &local_ed0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ef8,"sin",&local_ef9);
  local_f28.this = this;
  std::function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)>::
  function<FloatType::FloatType()::__7,void>
            ((function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)> *)
             &local_f20,&local_f28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f48,"Computes the sine of x.",&local_f49);
  Function::Function(&local_ed0,&local_ef8,1,&local_f20,&local_f48);
  local_ed8 = &local_e50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f70,"cos",&local_f71);
  local_fa0.this = this;
  std::function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)>::
  function<FloatType::FloatType()::__8,void>
            ((function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)> *)
             &local_f98,&local_fa0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_fc0,"Computes the cosine of x.",&local_fc1);
  Function::Function(&local_e50,&local_f70,1,&local_f98,&local_fc0);
  local_ed8 = &local_dd0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_fe8,"tan",&local_fe9);
  local_1018.this = this;
  std::function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)>::
  function<FloatType::FloatType()::__9,void>
            ((function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)> *)
             &local_1010,&local_1018);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1038,"Computes the tangent of x.",&local_1039);
  Function::Function(&local_dd0,&local_fe8,1,&local_1010,&local_1038);
  local_ed8 = &local_d50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1060,"sqrt",&local_1061);
  local_1090.this = this;
  std::function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)>::
  function<FloatType::FloatType()::__10,void>
            ((function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)> *)
             &local_1088,&local_1090);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_10b0,"Computes the square root of x.",&local_10b1);
  Function::Function(&local_d50,&local_1060,1,&local_1088,&local_10b0);
  local_ed8 = &local_cd0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_10d8,"asin",&local_10d9);
  local_1108.this = this;
  std::function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)>::
  function<FloatType::FloatType()::__11,void>
            ((function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)> *)
             &local_1100,&local_1108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1128,"Computes the inverse sine of x.",&local_1129);
  Function::Function(&local_cd0,&local_10d8,1,&local_1100,&local_1128);
  local_ed8 = &local_c50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1150,"acos",&local_1151);
  local_1180.this = this;
  std::function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)>::
  function<FloatType::FloatType()::__12,void>
            ((function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)> *)
             &local_1178,&local_1180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_11a0,"Computes the inverse cosine of x.",&local_11a1);
  Function::Function(&local_c50,&local_1150,1,&local_1178,&local_11a0);
  local_ed8 = &local_bd0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_11c8,"atan",&local_11c9);
  local_11f8.this = this;
  std::function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)>::
  function<FloatType::FloatType()::__13,void>
            ((function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)> *)
             &local_11f0,&local_11f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1218,"Computes the inverse tangent of x.",&local_1219);
  Function::Function(&local_bd0,&local_11c8,1,&local_11f0,&local_1218);
  local_ed8 = &local_b50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1240,"ln",&local_1241);
  local_1270.this = this;
  std::function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)>::
  function<FloatType::FloatType()::__14,void>
            ((function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)> *)
             &local_1268,&local_1270);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1290,"Computes the natural logarithm of x.",&local_1291);
  Function::Function(&local_b50,&local_1240,1,&local_1268,&local_1290);
  local_ed8 = &local_ad0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_12b8,"log",&local_12b9);
  local_12e8.this = this;
  std::function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)>::
  function<FloatType::FloatType()::__15,void>
            ((function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)> *)
             &local_12e0,&local_12e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1308,"Computes the 10-logarithm of x.",&local_1309);
  Function::Function(&local_ad0,&local_12b8,1,&local_12e0,&local_1308);
  local_ed8 = &local_a50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1330,"logb",&local_1331);
  local_1360.this = this;
  std::function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)>::
  function<FloatType::FloatType()::__16,void>
            ((function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)> *)
             &local_1358,&local_1360);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1380,"Computes the y-logarithm of x.",&local_1381);
  Function::Function(&local_a50,&local_1330,2,&local_1358,&local_1380);
  local_ed8 = &local_9d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_13a8,"ceil",&local_13a9);
  local_13d8.this = this;
  std::function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)>::
  function<FloatType::FloatType()::__17,void>
            ((function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)> *)
             &local_13d0,&local_13d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_13f8,"Ceils x.",&local_13f9);
  Function::Function(&local_9d0,&local_13a8,1,&local_13d0,&local_13f8);
  local_ed8 = &local_950;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1420,"floor",&local_1421);
  local_1450.this = this;
  std::function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)>::
  function<FloatType::FloatType()::__18,void>
            ((function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)> *)
             &local_1448,&local_1450);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1470,"Floors x.",&local_1471);
  Function::Function(&local_950,&local_1420,1,&local_1448,&local_1470);
  local_ed8 = &local_8d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1498,"round",&local_1499);
  local_14c8.this = this;
  std::function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)>::
  function<FloatType::FloatType()::__19,void>
            ((function<ResultValue(std::vector<ResultValue,std::allocator<ResultValue>>)> *)
             &local_14c0,&local_14c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_14e8,"Rounds x.",&local_14e9);
  Function::Function(&local_8d0,&local_1498,1,&local_14c0,&local_14e8);
  local_14ea = 0;
  local_850 = &local_ed0;
  local_848 = 0xd;
  std::allocator<Function>::allocator(&local_14eb);
  __l._M_len = local_848;
  __l._M_array = local_850;
  std::vector<Function,_std::allocator<Function>_>::vector(&local_840,__l,&local_14eb);
  EnvironmentScope::EnvironmentScope(&local_6f0,&local_728,&local_840);
  EnvironmentScope::operator=(&this->mEnvironment,&local_6f0);
  EnvironmentScope::~EnvironmentScope(&local_6f0);
  std::vector<Function,_std::allocator<Function>_>::~vector(&local_840);
  std::allocator<Function>::~allocator(&local_14eb);
  local_16f0 = (Function *)&local_850;
  do {
    local_16f0 = local_16f0 + -1;
    Function::~Function(local_16f0);
  } while (local_16f0 != &local_ed0);
  std::__cxx11::string::~string((string *)&local_14e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_14e9);
  std::function<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>)>::~function
            (&local_14c0);
  std::__cxx11::string::~string((string *)&local_1498);
  std::allocator<char>::~allocator((allocator<char> *)&local_1499);
  std::__cxx11::string::~string((string *)&local_1470);
  std::allocator<char>::~allocator((allocator<char> *)&local_1471);
  std::function<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>)>::~function
            (&local_1448);
  std::__cxx11::string::~string((string *)&local_1420);
  std::allocator<char>::~allocator((allocator<char> *)&local_1421);
  std::__cxx11::string::~string((string *)&local_13f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_13f9);
  std::function<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>)>::~function
            (&local_13d0);
  std::__cxx11::string::~string((string *)&local_13a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_13a9);
  std::__cxx11::string::~string((string *)&local_1380);
  std::allocator<char>::~allocator((allocator<char> *)&local_1381);
  std::function<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>)>::~function
            (&local_1358);
  std::__cxx11::string::~string((string *)&local_1330);
  std::allocator<char>::~allocator((allocator<char> *)&local_1331);
  std::__cxx11::string::~string((string *)&local_1308);
  std::allocator<char>::~allocator((allocator<char> *)&local_1309);
  std::function<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>)>::~function
            (&local_12e0);
  std::__cxx11::string::~string((string *)&local_12b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_12b9);
  std::__cxx11::string::~string((string *)&local_1290);
  std::allocator<char>::~allocator((allocator<char> *)&local_1291);
  std::function<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>)>::~function
            (&local_1268);
  std::__cxx11::string::~string((string *)&local_1240);
  std::allocator<char>::~allocator((allocator<char> *)&local_1241);
  std::__cxx11::string::~string((string *)&local_1218);
  std::allocator<char>::~allocator((allocator<char> *)&local_1219);
  std::function<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>)>::~function
            (&local_11f0);
  std::__cxx11::string::~string((string *)&local_11c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_11c9);
  std::__cxx11::string::~string((string *)&local_11a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_11a1);
  std::function<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>)>::~function
            (&local_1178);
  std::__cxx11::string::~string((string *)&local_1150);
  std::allocator<char>::~allocator((allocator<char> *)&local_1151);
  std::__cxx11::string::~string((string *)&local_1128);
  std::allocator<char>::~allocator((allocator<char> *)&local_1129);
  std::function<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>)>::~function
            (&local_1100);
  std::__cxx11::string::~string((string *)&local_10d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_10d9);
  std::__cxx11::string::~string((string *)&local_10b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_10b1);
  std::function<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>)>::~function
            (&local_1088);
  std::__cxx11::string::~string((string *)&local_1060);
  std::allocator<char>::~allocator((allocator<char> *)&local_1061);
  std::__cxx11::string::~string((string *)&local_1038);
  std::allocator<char>::~allocator((allocator<char> *)&local_1039);
  std::function<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>)>::~function
            (&local_1010);
  std::__cxx11::string::~string((string *)&local_fe8);
  std::allocator<char>::~allocator((allocator<char> *)&local_fe9);
  std::__cxx11::string::~string((string *)&local_fc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_fc1);
  std::function<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>)>::~function
            (&local_f98);
  std::__cxx11::string::~string((string *)&local_f70);
  std::allocator<char>::~allocator((allocator<char> *)&local_f71);
  std::__cxx11::string::~string((string *)&local_f48);
  std::allocator<char>::~allocator((allocator<char> *)&local_f49);
  std::function<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>)>::~function
            (&local_f20);
  std::__cxx11::string::~string((string *)&local_ef8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ef9);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>_>
  ::~unordered_map(&local_728);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>
  ::~allocator(&local_823);
  local_1708 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>
                *)&local_738;
  do {
    local_1708 = local_1708 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>
    ::~pair(local_1708);
  } while (local_1708 != &local_7c8);
  return;
}

Assistant:

FloatType::FloatType() {
	mBinaryOperators = {
		{ '^', Operator::binary('^', 6, OperatorAssociativity::RIGHT, [&](ResultValue lhs, ResultValue rhs) {
			return pow(lhs.floatValue(), rhs.floatValue());
		}) },
		{ '*', Operator::binary('*', 5, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.floatValue() * rhs.floatValue();
		}) },
		{ '/', Operator::binary('/', 5, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.floatValue() / rhs.floatValue();
		}) },
		{ '+', Operator::binary('+', 4, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.floatValue() + rhs.floatValue();
		}) },
		{ '-', Operator::binary('-', 4, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.floatValue() - rhs.floatValue();
		}) },
		{ '=', Operator::binary('=', 1, OperatorAssociativity::RIGHT, [&](ResultValue lhs, ResultValue rhs) {
			return ResultValue();
		}) }
	};

	mUnaryOperators = {
		{ '-', Operator::unary('-', 7, OperatorAssociativity::LEFT, [&](ResultValue op) {
			return -op.floatValue();
		}) }
	};

	mEnvironment = EnvironmentScope({
										{ "pi", ResultValue(3.141592653589793238463) },
										{ "e", ResultValue(2.718281828459045235360) },
									}, {
										Function("sin", 1, [this](FunctionArguments args) {
											return ResultValue(sin(args.at(0).floatValue()));
										}, "Computes the sine of x."),
										Function("cos", 1, [this](FunctionArguments args) {
											return ResultValue(cos(args.at(0).floatValue()));
										}, "Computes the cosine of x."),
										Function("tan", 1, [this](FunctionArguments args) {
											return ResultValue(tan(args.at(0).floatValue()));
										}, "Computes the tangent of x."),
										Function("sqrt", 1, [this](FunctionArguments args) {
											return ResultValue(sqrt(args.at(0).floatValue()));
										}, "Computes the square root of x."),
										Function("asin", 1, [this](FunctionArguments args) {
											return ResultValue(asin(args.at(0).floatValue()));
										}, "Computes the inverse sine of x."),
										Function("acos", 1, [this](FunctionArguments args) {
											return ResultValue(acos(args.at(0).floatValue()));
										}, "Computes the inverse cosine of x."),
										Function("atan", 1, [this](FunctionArguments args) {
											return ResultValue(atan(args.at(0).floatValue()));
										}, "Computes the inverse tangent of x."),
										Function("ln", 1, [this](FunctionArguments args) {
											return ResultValue(log(args.at(0).floatValue()));
										}, "Computes the natural logarithm of x."),
										Function("log", 1, [this](FunctionArguments args) {
											return ResultValue(log10(args.at(0).floatValue()));
										}, "Computes the 10-logarithm of x."),
										Function("logb", 2, [this](FunctionArguments args) {
											return ResultValue(log(args.at(0).floatValue()) / log(args.at(1).floatValue()));
										}, "Computes the y-logarithm of x."),
										Function("ceil", 1, [this](FunctionArguments x) {
											return ResultValue(ceil(x.at(0).floatValue()));
										}, "Ceils x."),
										Function("floor", 1, [this](FunctionArguments x) {
											return ResultValue(floor(x.at(0).floatValue()));
										}, "Floors x."),
										Function("round", 1, [this](FunctionArguments x) {
											return ResultValue(round(x.at(0).floatValue()));
										}, "Rounds x."),
									});
}